

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateWrapperFieldSetterDocComment
               (Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  undefined1 is_descriptor;
  char *pcVar3;
  string_view value;
  string_view input;
  string_view local_160;
  string_view local_150;
  string local_140;
  string_view local_120;
  string local_110;
  undefined1 local_f0 [16];
  string local_e0;
  undefined1 local_c0 [16];
  string local_b0;
  string_view local_90 [2];
  string local_70;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  FieldDescriptor *local_20;
  FieldDescriptor *primitiveField;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  primitiveField = field;
  field_local = (FieldDescriptor *)printer;
  pDVar2 = FieldDescriptor::message_type(field);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"value");
  local_20 = Descriptor::FindFieldByName(pDVar2,local_30);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"/**\n");
  io::Printer::Print<>((Printer *)pFVar1,local_40);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,
             " * Sets the field by wrapping a primitive type in a ^message_name^ object.\n\n");
  pDVar2 = FieldDescriptor::message_type(primitiveField);
  FullClassName<google::protobuf::Descriptor>(&local_70,pDVar2,false);
  pcVar3 = "message_name";
  io::Printer::Print<char[13],std::__cxx11::string>
            ((Printer *)pFVar1,local_50,(char (*) [13])"message_name",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>((Printer *)field_local,primitiveField);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_90," * Generated from protobuf field <code>^def^</code>\n");
  FieldDescriptor::DebugString_abi_cxx11_(&local_110,primitiveField);
  local_f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_110);
  value._M_len = local_f0._8_8_;
  value._M_str = pcVar3;
  php::(anonymous_namespace)::FirstLineOf_abi_cxx11_(&local_e0,local_f0._0_8_,value);
  local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e0);
  input._M_len = local_c0._8_8_;
  input._M_str = pcVar3;
  php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_(&local_b0,local_c0._0_8_,input);
  is_descriptor = 99;
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)pFVar1,local_90[0],(char (*) [4])0xa32d63,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_110);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120," * @param ^php_type^|null $var\n");
  php::(anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)local_20,(FieldDescriptor *)0x0,(bool)is_descriptor
            );
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)pFVar1,local_120,(char (*) [9])"php_type",&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150," * @return $this\n");
  io::Printer::Print<>((Printer *)pFVar1,local_150);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160," */\n");
  io::Printer::Print<>((Printer *)pFVar1,local_160);
  return;
}

Assistant:

void GenerateWrapperFieldSetterDocComment(io::Printer* printer,
                                          const FieldDescriptor* field) {
  // Generate a doc comment for the special setXXXValue methods that are
  // generated for wrapper types.
  const FieldDescriptor* primitiveField =
      field->message_type()->FindFieldByName("value");
  printer->Print("/**\n");
  printer->Print(
      " * Sets the field by wrapping a primitive type in a ^message_name^ "
      "object.\n\n",
      "message_name", FullClassName(field->message_type(), false));
  GenerateDocCommentBody(printer, field);
  printer->Print(" * Generated from protobuf field <code>^def^</code>\n", "def",
                 EscapePhpdoc(FirstLineOf(field->DebugString())));
  printer->Print(" * @param ^php_type^|null $var\n", "php_type",
                 PhpSetterTypeName(primitiveField, false));
  printer->Print(" * @return $this\n");
  printer->Print(" */\n");
}